

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O2

Ptr<ImageView> __thiscall
myvk::ImageView::Create
          (ImageView *this,Ptr<ImageBase> *image,VkImageViewType view_type,
          VkImageAspectFlags aspect_mask)

{
  element_type *peVar1;
  Ptr<ImageView> PVar2;
  VkComponentMapping local_18;
  
  peVar1 = (image->super___shared_ptr<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.r = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.g = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.b = VK_COMPONENT_SWIZZLE_IDENTITY;
  local_18.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  PVar2 = Create(this,image,view_type,peVar1->m_format,aspect_mask,0,peVar1->m_mip_levels,0,
                 peVar1->m_array_layers,&local_18);
  PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<ImageView>)PVar2.super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<ImageView> ImageView::Create(const Ptr<ImageBase> &image, VkImageViewType view_type,
                                 VkImageAspectFlags aspect_mask) {
	return Create(image, view_type, image->GetFormat(), aspect_mask, 0, image->GetMipLevels(), 0,
	              image->GetArrayLayers());
}